

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cpp
# Opt level: O3

void __thiscall RemoveBreakpointParams::Deserialize(RemoveBreakpointParams *this,json *json)

{
  element_type *peVar1;
  bool bVar2;
  reference pvVar3;
  reference other;
  shared_ptr<BreakPoint> bp;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  breakPoint;
  iterator __end2;
  iterator __begin2;
  value_type local_a0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_70;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"breakPoints");
  if (pvVar3->m_type == array) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)json,"breakPoints");
    local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_50.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_50.m_object = pvVar3;
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::set_begin(&local_50);
    local_70.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_70.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_70.m_object = pvVar3;
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::set_end(&local_70);
    bVar2 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_50,&local_70);
    if (!bVar2) {
      do {
        other = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&local_50);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&local_80,other);
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xa0);
        (local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = 1;
        (local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count = 1;
        (local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017f118;
        peVar1 = (element_type *)
                 (local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi + 1);
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
        _M_use_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
        _M_weak_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
        _M_use_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
        _M_weak_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[6].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[7].
        _M_use_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[7].
        _M_weak_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[8].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
        _M_use_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
        _M_weak_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
        _M_use_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
        _M_weak_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[6].
        _M_use_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[6].
        _M_weak_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[7].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[8].
        _M_use_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[8].
        _M_weak_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[9].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _vptr__Sp_counted_base = (_func_int **)&PTR__BreakPoint_0017eea8;
        *(_Atomic_word **)
         &local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_use_count =
             &local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              [2]._M_use_count;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
        _vptr__Sp_counted_base = (_func_int **)0x0;
        *(_Atomic_word **)
         &local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
          _M_use_count =
             &local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              [4]._M_use_count;
        *(_Atomic_word **)
         &local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
          _M_use_count =
             &local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              [6]._M_use_count;
        *(_Atomic_word **)
         &local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[7].
          _M_use_count =
             &local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              [8]._M_use_count;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[9].
        _M_use_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[9].
        _M_weak_count = 0;
        local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&local_90,&local_80);
        (*(peVar1->super_JsonProtocol)._vptr_JsonProtocol[3])(peVar1,&local_90);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_90);
        std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::
        push_back(&this->breakPoints,&local_a0);
        if (local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_80);
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++(&local_50);
        bVar2 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          (&local_50,&local_70);
      } while (!bVar2);
    }
  }
  return;
}

Assistant:

void RemoveBreakpointParams::Deserialize(nlohmann::json json) {
	if (json["breakPoints"].is_array()) {
		for (auto breakPoint: json["breakPoints"]) {
			auto bp = std::make_shared<BreakPoint>();
			bp->Deserialize(breakPoint);
			breakPoints.push_back(bp);
		}
	}
}